

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O2

qreal __thiscall QHexView::cellWidth(QHexView *this)

{
  qreal qVar1;
  QArrayDataPointer<char16_t> local_28;
  
  QString::QString((QString *)&local_28," ");
  qVar1 = (qreal)QFontMetricsF::horizontalAdvance((QString *)&this->m_fontmetrics,(int)&local_28);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  return qVar1;
}

Assistant:

qreal QHexView::cellWidth() const {
#if QT_VERSION >= QT_VERSION_CHECK(5, 11, 0)
    return m_fontmetrics.horizontalAdvance(" ");
#else
    return m_fontmetrics.width(" ");
#endif
}